

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<unsigned_short,_false,_false>::DirectGetItem
          (TypedArray<unsigned_short,_false,_false> *this,uint32 index)

{
  Var pvVar1;
  uint32 index_local;
  TypedArray<unsigned_short,_false,_false> *this_local;
  
  pvVar1 = BaseTypedDirectGetItem(this,index);
  return pvVar1;
}

Assistant:

inline Var Uint16Array::DirectGetItem(__in uint32 index)
    {
        return BaseTypedDirectGetItem(index);
    }